

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_form.c
# Opt level: O0

int dwarf_formaddr(Dwarf_Attribute attr,Dwarf_Addr *return_addr,Dwarf_Error *error)

{
  Dwarf_Bool DVar1;
  Dwarf_Byte_Ptr pDVar2;
  Dwarf_Byte_Ptr readend;
  Dwarf_Addr _ltmp;
  Dwarf_Small *section_end;
  int res;
  Dwarf_Half attrform;
  Dwarf_CU_Context_conflict cu_context;
  Dwarf_Addr ret_addr;
  Dwarf_Debug dbg;
  Dwarf_Error *error_local;
  Dwarf_Addr *return_addr_local;
  Dwarf_Attribute attr_local;
  
  ret_addr = 0;
  cu_context = (Dwarf_CU_Context_conflict)0x0;
  _res = (Dwarf_CU_Context_conflict)0x0;
  section_end._6_2_ = 0;
  section_end._0_4_ = 0;
  dbg = (Dwarf_Debug)error;
  error_local = (Dwarf_Error *)return_addr;
  return_addr_local = (Dwarf_Addr *)attr;
  section_end._0_4_ =
       get_attr_dbg((Dwarf_Debug *)&ret_addr,(Dwarf_CU_Context_conflict *)&res,attr,error);
  attr_local._4_4_ = (int)section_end;
  if ((int)section_end == 0) {
    section_end._6_2_ = *(ushort *)((long)return_addr_local + 2);
    DVar1 = dwarf_addr_form_is_indexed((uint)section_end._6_2_);
    if (DVar1 == 0) {
      if ((section_end._6_2_ == 1) || ((_res->cc_producer == '\x01' && (section_end._6_2_ == 0x10)))
         ) {
        _ltmp = (Dwarf_Addr)_dwarf_calculate_info_section_end_ptr(_res);
        readend = (Dwarf_Byte_Ptr)0x0;
        pDVar2 = (Dwarf_Byte_Ptr)(return_addr_local[2] + (long)(int)(uint)_res->cc_address_size);
        if (pDVar2 < (Dwarf_Byte_Ptr)return_addr_local[2]) {
          _dwarf_error_string((Dwarf_Debug)ret_addr,(Dwarf_Error *)dbg,0x14b,
                              "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section");
          attr_local._4_4_ = 1;
        }
        else if (_ltmp < pDVar2) {
          _dwarf_error_string((Dwarf_Debug)ret_addr,(Dwarf_Error *)dbg,0x14b,
                              "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section"
                             );
          attr_local._4_4_ = 1;
        }
        else {
          (**(code **)(ret_addr + 0x1bf8))(&readend,return_addr_local[2],_res->cc_address_size);
          *error_local = (Dwarf_Error)readend;
          attr_local._4_4_ = 0;
        }
      }
      else {
        generate_form_error((Dwarf_Debug)ret_addr,(Dwarf_Error *)dbg,(uint)section_end._6_2_,0x72,
                            "DW_DLE_ATTR_FORM_BAD","dwarf_formaddr");
        attr_local._4_4_ = 1;
      }
    }
    else {
      attr_local._4_4_ =
           _dwarf_look_in_local_and_tied
                     (section_end._6_2_,_res,(Dwarf_Small *)return_addr_local[2],
                      (Dwarf_Addr *)error_local,(Dwarf_Error *)dbg);
    }
  }
  return attr_local._4_4_;
}

Assistant:

int
dwarf_formaddr(Dwarf_Attribute attr,
    Dwarf_Addr * return_addr, Dwarf_Error * error)
{
    Dwarf_Debug dbg = 0;
    Dwarf_Addr ret_addr = 0;
    Dwarf_CU_Context cu_context = 0;
    Dwarf_Half attrform = 0;
    int res = 0;

    res  = get_attr_dbg(&dbg,&cu_context,attr,error);
    if (res != DW_DLV_OK) {
        return res;
    }
    attrform = attr->ar_attribute_form;
    if (dwarf_addr_form_is_indexed(attrform)) {
        res = _dwarf_look_in_local_and_tied(
            attrform,
            cu_context,
            attr->ar_debug_ptr,
            return_addr,
            error);
        return res;
    }
    if (attrform == DW_FORM_addr ||
        (cu_context->cc_producer == CC_PROD_METROWERKS &&
        attrform == DW_FORM_ref_addr)
            /* Allowance of
            DW_FORM_ref_addr was a mistake. The value returned in that
            case is NOT an address it is a global debug_info
            offset (ie, not CU-relative offset within the CU
            in debug_info).
            A Metrowerks old C generates ref_adder!
            The DWARF2 document refers to it as an address
            (misleadingly) in sec 6.5.4 where it describes
            the reference form. It is
            address-sized so that the linker can easily update it, but
            it is a reference inside the debug_info section. No longer
            allowed except for Metrowerks C. */
        ) {
        Dwarf_Small *section_end =
            _dwarf_calculate_info_section_end_ptr(cu_context);

        READ_UNALIGNED_CK(dbg, ret_addr, Dwarf_Addr,
            attr->ar_debug_ptr,
            cu_context->cc_address_size,
            error,section_end);
        *return_addr = ret_addr;
        return DW_DLV_OK;
    }
    generate_form_error(dbg,error,attrform,
        DW_DLE_ATTR_FORM_BAD,
        "DW_DLE_ATTR_FORM_BAD",
        "dwarf_formaddr");
    return DW_DLV_ERROR;
}